

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

void CheckMultiHeaders(TidyDocImpl *doc,Node *node)

{
  bool bVar1;
  bool bVar2;
  Bool BVar3;
  int iVar4;
  AttVal *local_40;
  AttVal *av;
  int flag;
  Bool validColSpanColumns;
  Bool validColSpanRows;
  Node *temp;
  Node *TNode;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  bVar1 = true;
  bVar2 = true;
  BVar3 = Level1_Enabled(doc);
  if ((BVar3 != no) && (node->content != (Node *)0x0)) {
    for (temp = node->content; temp != (Node *)0x0; temp = temp->next) {
      if ((((temp != (Node *)0x0) && (temp->tag != (Dict *)0x0)) && (temp->tag->id == TidyTag_TR))
         && (temp->content != (Node *)0x0)) {
        for (_validColSpanColumns = temp->content; _validColSpanColumns != (Node *)0x0;
            _validColSpanColumns = _validColSpanColumns->next) {
          if (((_validColSpanColumns != (Node *)0x0) && (_validColSpanColumns->tag != (Dict *)0x0))
             && (_validColSpanColumns->tag->id == TidyTag_TH)) {
            for (local_40 = _validColSpanColumns->attributes; local_40 != (AttVal *)0x0;
                local_40 = local_40->next) {
              if (((local_40 != (AttVal *)0x0) && (local_40->dict != (Attribute *)0x0)) &&
                 ((local_40->dict->id == TidyAttr_COLSPAN &&
                  (iVar4 = atoi(local_40->value), 1 < iVar4)))) {
                bVar2 = false;
              }
              if ((((local_40 != (AttVal *)0x0) && (local_40->dict != (Attribute *)0x0)) &&
                  (local_40->dict->id == TidyAttr_ROWSPAN)) &&
                 (iVar4 = atoi(local_40->value), 1 < iVar4)) {
                bVar1 = false;
              }
            }
          }
        }
      }
    }
    if (!bVar1) {
      prvTidyReportAccessError(doc,node,0x2c5);
      prvTidyDialogue(doc,0x20a);
    }
    if (!bVar2) {
      prvTidyReportAccessError(doc,node,0x2c4);
      prvTidyDialogue(doc,0x20a);
    }
  }
  return;
}

Assistant:

static void CheckMultiHeaders( TidyDocImpl* doc, Node* node )
{
    Node* TNode;
    Node* temp;
    
    Bool validColSpanRows = yes;
    Bool validColSpanColumns = yes;

    int flag = 0;

    if (Level1_Enabled( doc ))
    {
        if (node->content != NULL)
        {
            TNode = node->content;

            /* 
               Checks for column of multiple headers found 
               within a data table. 
            */
            while (TNode != NULL)
            {
                if ( nodeIsTR(TNode) )
                {
                    flag = 0; /* Issue #168 - access test 5-2-1-2 */
                    if (TNode->content != NULL)
                    {
                        temp = TNode->content;

                        /* The number of TH elements found within TR element */
                        if (flag == 0)
                        {
                            while (temp != NULL)
                            {
                                /* 
                                   Must contain at least one TH element 
                                   within in the TR element 
                                */
                                if ( nodeIsTH(temp) )
                                {
                                    AttVal* av;
                                    for (av = temp->attributes; av != NULL; av = av->next)
                                    {
                                        if ( attrIsCOLSPAN(av)
                                             && (atoi(av->value) > 1) )
                                            validColSpanColumns = no;

                                        if ( attrIsROWSPAN(av)
                                             && (atoi(av->value) > 1) )
                                            validColSpanRows = no;
                                    }
                                }

                                temp = temp->next;
                            }    

                            flag = 1;
                        }
                    }
                }
            
                TNode = TNode->next;
            }

            /* Displays HTML 4 Table Algorithm when multiple column of headers used */
            if (validColSpanRows == no)
            {
                TY_(ReportAccessError)( doc, node, DATA_TABLE_REQUIRE_MARKUP_ROW_HEADERS );
                TY_(Dialogue)( doc, TEXT_HTML_T_ALGORITHM );
            }

            if (validColSpanColumns == no)
            {
                TY_(ReportAccessError)( doc, node, DATA_TABLE_REQUIRE_MARKUP_COLUMN_HEADERS );
                TY_(Dialogue)( doc, TEXT_HTML_T_ALGORITHM );
            }
        }
    }
}